

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeBinaryProvider::addAllMimeTypes(QMimeBinaryProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  QMimeType *pQVar6;
  Data *pDVar7;
  bool bVar8;
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *pDVar9;
  ulong uVar10;
  long lVar11;
  size_t asize;
  long lVar12;
  QSet<QString> *this_00;
  const_iterator cVar13;
  const_iterator __it;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  piter local_98;
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *local_88;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  loadMimeTypeList(this);
  this_00 = &this->m_mimetypeNames;
  if ((result->d).size == 0) {
    pDVar7 = (this_00->q_hash).d;
    if (pDVar7 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = pDVar7->size;
    }
    QList<QMimeType>::reserve(result,asize);
    local_50._0_16_ = QHash<QString,_QHashDummyValue>::begin(&this_00->q_hash);
    while( true ) {
      if (local_50.d == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0 &&
          local_50.ptr == 0) break;
      pSVar2 = (local_50.d)->spans;
      uVar10 = local_50.ptr >> 7;
      QMimeTypePrivate::QMimeTypePrivate
                ((QMimeTypePrivate *)&local_88,
                 (QString *)
                 (pSVar2[uVar10].entries + pSVar2[uVar10].offsets[(uint)local_50.ptr & 0x7f]));
      QMimeType::QMimeType((QMimeType *)&local_68,(QMimeTypePrivate *)&local_88);
      QList<QMimeType>::emplaceBack<QMimeType>(result,(QMimeType *)&local_68);
      QMimeType::~QMimeType((QMimeType *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> *)&local_50);
    }
  }
  else {
    local_98 = (piter)QHash<QString,_QHashDummyValue>::begin(&this_00->q_hash);
    while( true ) {
      if (local_98.d == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0 &&
          local_98.bucket == 0) break;
      pSVar2 = (local_98.d)->spans;
      uVar10 = local_98.bucket >> 7;
      pEVar3 = pSVar2[uVar10].entries;
      bVar1 = pSVar2[uVar10].offsets[(uint)local_98.bucket & 0x7f];
      __it.i = (result->d).ptr;
      lVar11 = (result->d).size;
      local_b0.d = *(Data **)pEVar3[bVar1].storage.data;
      pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
      pcVar5 = *(char16_t **)(pEVar3[bVar1].storage.data + 0x10);
      if ((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_b0.d ==
          (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
        local_68.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_b0.d)->ref).atomic._q_value.
        super___atomic_base<int>._M_i =
             (((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_b0.d)->ref).atomic.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_68.d = local_b0.d;
      }
      if ((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_68.d ==
          (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
        local_88 = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
      }
      else {
        LOCK();
        (((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_68.d)->ref).atomic._q_value.
        super___atomic_base<int>._M_i =
             (((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_68.d)->ref).atomic.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_88 = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_68.d;
      }
      if (local_88 == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
        pDVar9 = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
      }
      else {
        LOCK();
        (local_88->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (local_88->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar9 = local_88;
      }
      local_50.ptr = (char16_t *)pDVar4;
      local_50.d = (Data *)pDVar9;
      if (pDVar9 == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
        pDVar9 = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
      }
      else {
        LOCK();
        (pDVar9->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar9->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b0.ptr = (char16_t *)pDVar4;
      local_b0.size = (qsizetype)pcVar5;
      local_80.d = pDVar4;
      local_80.ptr = pcVar5;
      local_68.ptr = (char16_t *)pDVar4;
      local_68.size = (qsizetype)pcVar5;
      local_50.size = (qsizetype)pcVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (pDVar9 != (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
        LOCK();
        (pDVar9->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar9->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar6 = __it.i + lVar11;
      lVar12 = lVar11 << 3;
      local_88 = pDVar9;
      local_80.d = pDVar4;
      local_80.ptr = pcVar5;
      for (lVar11 = lVar11 >> 2; cVar13.i = __it.i, 0 < lVar11; lVar11 = lVar11 + -1) {
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,__it);
        if (bVar8) goto LAB_00449992;
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,__it.i + 1);
        cVar13.i = __it.i + 1;
        if (bVar8) goto LAB_00449992;
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,__it.i + 2);
        cVar13.i = __it.i + 2;
        if (bVar8) goto LAB_00449992;
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,__it.i + 3);
        cVar13.i = __it.i + 3;
        if (bVar8) goto LAB_00449992;
        __it.i = __it.i + 4;
        lVar12 = lVar12 + -0x20;
      }
      lVar12 = lVar12 >> 3;
      if (lVar12 == 1) {
LAB_00449a19:
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,__it);
        cVar13.i = pQVar6;
        if (bVar8) {
          cVar13.i = __it.i;
        }
      }
      else if (lVar12 == 2) {
LAB_00449967:
        bVar8 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_88,cVar13);
        if (!bVar8) {
          __it.i = cVar13.i + 1;
          goto LAB_00449a19;
        }
      }
      else {
        cVar13.i = pQVar6;
        if ((lVar12 == 3) &&
           (bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                    operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                                *)&local_88,__it), cVar13.i = __it.i, !bVar8)) {
          cVar13.i = __it.i + 1;
          goto LAB_00449967;
        }
      }
LAB_00449992:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      lVar11 = (result->d).size;
      pQVar6 = (result->d).ptr;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (cVar13.i == pQVar6 + lVar11) {
        QMimeTypePrivate::QMimeTypePrivate
                  ((QMimeTypePrivate *)&local_88,(QString *)(pEVar3 + bVar1));
        QMimeType::QMimeType((QMimeType *)&local_50,(QMimeTypePrivate *)&local_88);
        QList<QMimeType>::emplaceBack<QMimeType>(result,(QMimeType *)&local_50);
        QMimeType::~QMimeType((QMimeType *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::operator++(&local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    loadMimeTypeList();
    if (result.isEmpty()) {
        result.reserve(m_mimetypeNames.size());
        for (const QString &name : std::as_const(m_mimetypeNames))
            result.append(QMimeType(QMimeTypePrivate(name)));
    } else {
        for (const QString &name : std::as_const(m_mimetypeNames))
            if (std::find_if(result.constBegin(), result.constEnd(), [name](const QMimeType &mime) -> bool { return mime.name() == name; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(name)));
    }
}